

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O3

iterator __thiscall
Type1ToType2Converter::MergeAltenratingOperators
          (Type1ToType2Converter *this,iterator inStartingNode,unsigned_short inAlternatingOpcode)

{
  uint uVar1;
  _List_node_base *p_Var2;
  iterator __position;
  uint uVar3;
  
  p_Var2 = (inStartingNode._M_node)->_M_next;
  if (*(unsigned_short *)&p_Var2[1]._M_next == inAlternatingOpcode) {
    __position._M_node = p_Var2;
    uVar3 = (uint)inAlternatingOpcode;
    do {
      if (0x27 < (ulong)((long)&(inStartingNode._M_node[2]._M_prev)->_M_next +
                        (long)&(__position._M_node[2]._M_prev)->_M_next)) {
        return (iterator)__position._M_node;
      }
      std::__cxx11::list<long,std::allocator<long>>::insert<std::_List_iterator<long>,void>
                ((list<long,std::allocator<long>> *)&inStartingNode._M_node[1]._M_prev,
                 (const_iterator)&inStartingNode._M_node[1]._M_prev,__position._M_node[1]._M_prev,
                 (_List_iterator<long>)&__position._M_node[1]._M_prev);
      p_Var2 = (__position._M_node)->_M_next;
      std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::_M_erase
                (&this->mConversionProgram,__position);
      uVar1 = *(uint *)&inStartingNode._M_node[1]._M_next;
      if ((short)uVar1 == (short)uVar3) {
        uVar1 = (uint)inAlternatingOpcode;
      }
      __position._M_node = p_Var2;
      uVar3 = uVar1;
    } while ((short)uVar1 == *(short *)&p_Var2[1]._M_next);
  }
  return (iterator)p_Var2;
}

Assistant:

ConversionNodeList::iterator Type1ToType2Converter::MergeAltenratingOperators(ConversionNodeList::iterator inStartingNode,
																			  unsigned short inAlternatingOpcode)
{
	ConversionNodeList::iterator itNext = inStartingNode;
	++itNext;
	unsigned short currentMarker = inAlternatingOpcode;

	while(currentMarker == itNext->mMarkerType && (inStartingNode->mOperands.size()  + itNext->mOperands.size() < scMergeLimit))
	{
		inStartingNode->mOperands.insert(inStartingNode->mOperands.end(),itNext->mOperands.begin(),itNext->mOperands.end());
		itNext = mConversionProgram.erase(itNext);
		currentMarker = inStartingNode->mMarkerType == currentMarker ? inAlternatingOpcode:inStartingNode->mMarkerType;
	}
	return itNext;
}